

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

DynamicObject * __thiscall
JsrtDebuggerObjectFunction::GetJSONObject
          (JsrtDebuggerObjectFunction *this,ScriptContext *scriptContext,bool forceSetValueProp)

{
  FunctionBody *pFVar1;
  ULONG UVar2;
  int iVar3;
  uint uVar4;
  uint value;
  JavascriptLibrary *pJVar5;
  Utf8SourceInfo *utf8SourceInfo;
  undefined4 extraout_var;
  JavascriptString *jsString;
  JsrtDebugPropertyId local_44;
  JsrtDebugPropertyId local_40;
  JsrtDebugPropertyId local_3c;
  JsrtDebugPropertyId local_38;
  JsrtDebugPropertyId local_34;
  FunctionBody *local_30;
  FunctionBody *functionBody;
  DynamicObject *functionObject;
  ScriptContext *pSStack_18;
  bool forceSetValueProp_local;
  ScriptContext *scriptContext_local;
  JsrtDebuggerObjectFunction *this_local;
  
  functionObject._7_1_ = forceSetValueProp;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  pJVar5 = Js::ScriptContext::GetLibrary(scriptContext);
  functionBody = (FunctionBody *)Js::JavascriptLibrary::CreateObject(pJVar5,false,0);
  local_30 = Js::JavascriptFunction::GetFunctionBody(this->javascriptFunction);
  pFVar1 = functionBody;
  utf8SourceInfo = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)local_30);
  JsrtDebugUtils::AddScriptIdToObject((DynamicObject *)pFVar1,utf8SourceInfo);
  pFVar1 = functionBody;
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_34,line);
  UVar2 = Js::ParseableFunctionInfo::GetLineNumber(&local_30->super_ParseableFunctionInfo);
  JsrtDebugUtils::AddPropertyToObject((DynamicObject *)pFVar1,local_34,UVar2,pSStack_18);
  pFVar1 = functionBody;
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_38,column);
  UVar2 = Js::ParseableFunctionInfo::GetColumnNumber(&local_30->super_ParseableFunctionInfo);
  JsrtDebugUtils::AddPropertyToObject((DynamicObject *)pFVar1,local_38,UVar2,pSStack_18);
  pFVar1 = functionBody;
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_3c,name);
  iVar3 = (*(local_30->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
  uVar4 = (*(local_30->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])();
  JsrtDebugUtils::AddPropertyToObject
            ((DynamicObject *)pFVar1,local_3c,(char16 *)CONCAT44(extraout_var,iVar3),(ulong)uVar4,
             pSStack_18);
  pFVar1 = functionBody;
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_40,type);
  pJVar5 = Js::ScriptContext::GetLibrary(pSStack_18);
  jsString = Js::JavascriptLibrary::GetFunctionTypeDisplayString(pJVar5);
  JsrtDebugUtils::AddPropertyToObject((DynamicObject *)pFVar1,local_40,jsString,pSStack_18);
  pFVar1 = functionBody;
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_44,handle);
  value = JsrtDebuggerObjectBase::GetHandle(&this->super_JsrtDebuggerObjectBase);
  JsrtDebugUtils::AddPropertyToObject((DynamicObject *)pFVar1,local_44,value,pSStack_18);
  return (DynamicObject *)functionBody;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectFunction::GetJSONObject(Js::ScriptContext * scriptContext, bool forceSetValueProp)
{
    Js::DynamicObject* functionObject = scriptContext->GetLibrary()->CreateObject();

    Js::FunctionBody* functionBody  = this->javascriptFunction->GetFunctionBody();
    JsrtDebugUtils::AddScriptIdToObject(functionObject, functionBody->GetUtf8SourceInfo());
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::line, (uint32)functionBody->GetLineNumber(), scriptContext);
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::column, (uint32)functionBody->GetColumnNumber(), scriptContext);
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::name, functionBody->GetDisplayName(), functionBody->GetDisplayNameLength(), scriptContext);
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::type, scriptContext->GetLibrary()->GetFunctionTypeDisplayString(), scriptContext);
    JsrtDebugUtils::AddPropertyToObject(functionObject, JsrtDebugPropertyId::handle, this->GetHandle(), scriptContext);

    return functionObject;
}